

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O0

int grapg_5_3::m_bfs(m_graph g,int v)

{
  code *pcVar1;
  int aiStack_48 [2];
  m_graph *local_40;
  long local_38;
  int local_30;
  int local_2c;
  int j;
  int i;
  int r;
  int f;
  unsigned_long __vla_expr0;
  int local_c;
  int v_local;
  
  __vla_expr0 = (unsigned_long)aiStack_48;
  local_40 = &g;
  *(undefined4 *)(visited + (long)v * 4) = 1;
  _r = (ulong)(uint)g.vnum;
  local_38 = (long)aiStack_48 - (_r * 4 + 0xf & 0xfffffffffffffff0);
  i = -1;
  j = 0;
  for (local_2c = 0; local_2c < g.vnum; local_2c = local_2c + 1) {
    if (*(int *)(visited + (long)local_2c * 4) == 0) {
      *(undefined4 *)(visited + (long)local_2c * 4) = 1;
      *(int *)(local_38 + (long)j * 4) = local_2c;
      j = j + 1;
      while (i < j) {
        i = i + 1;
        local_2c = *(int *)(local_38 + (long)i * 4);
        for (local_30 = 0; local_30 < g.vnum; local_30 = local_30 + 1) {
          if ((local_40->arc[local_2c][local_30] == 1) &&
             (*(int *)(visited + (long)local_30 * 4) == 0)) {
            *(undefined4 *)(visited + (long)local_30 * 4) = 1;
            *(int *)(local_38 + (long)j * 4) = local_30;
            j = j + 1;
          }
        }
      }
    }
  }
  pcVar1 = (code *)invalidInstructionException();
  local_c = v;
  (*pcVar1)();
}

Assistant:

int m_bfs(m_graph g, int v) {
        visited[v] = 1;
        //visit;
        int q[g.vnum];
        int f = -1, r = 0;
        for (int i = 0; i < g.vnum; i++) {
            if (visited[i] == 0) {
                visited[i] = 1;
                q[r++] = i;
                while (f < r) {
                    i = q[++f];
                    for (int j = 0; j < g.vnum; j++) {
                        if (g.arc[i][j] == 1 && visited[j] == 0) {
                            visited[j] = 1;
                            //visit
                            q[r++] = j;
                        }
                    }
                }
            }
        }
    }